

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O0

char * get_mem_options_inner(json_t *root,char *option_name,int *result,int should_free)

{
  json_t *json;
  size_t __size;
  char *__src;
  size_t length;
  char *option_value;
  json_t *option_item;
  int should_free_local;
  int *result_local;
  char *option_name_local;
  json_t *root_local;
  
  json = json_object_get(root,option_name);
  if (json == (json_t *)0x0) {
    if (should_free != 0) {
      json_decref(root);
    }
    *result = 0;
    root_local = (json_t *)0x0;
  }
  else if ((json == (json_t *)0x0) || (json->type != JSON_MEM)) {
    *result = -1;
    fprintf(_stderr,"error: option item %s is expected to be a mem\n",option_name);
    if (should_free != 0) {
      json_decref(root);
    }
    root_local = (json_t *)0x0;
  }
  else {
    __size = json_mem_length(json);
    root_local = (json_t *)malloc(__size);
    __src = json_mem_value(json);
    memcpy(root_local,__src,__size);
    *result = 1;
    if (should_free != 0) {
      json_decref(root);
    }
  }
  return (char *)root_local;
}

Assistant:

static char * get_mem_options_inner(json_t * root, const char * option_name, int * result, int should_free)
{
	json_t *option_item;
	char * option_value;
	size_t length;

	option_item = json_object_get(root, option_name);
	if (!option_item)
	{
		if (should_free)
			json_decref(root);
		*result = 0;
		return NULL;
	}

	if (!json_is_mem(option_item))
	{
		*result = -1;
		fprintf(stderr, "error: option item %s is expected to be a mem\n", option_name);
		if (should_free)
			json_decref(root);
		return NULL;
	}

	length = json_mem_length(option_item);
	option_value = malloc(length);
	memcpy(option_value, json_mem_value(option_item), length);
	*result = 1;
	if (should_free)
		json_decref(root);
	return option_value;
}